

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O2

void __thiscall
cfd::core::ConfidentialTxOut::SetCommitment
          (ConfidentialTxOut *this,ConfidentialAssetId *asset,ConfidentialValue *confidential_value,
          ConfidentialNonce *nonce,ByteData *surjection_proof,ByteData *range_proof)

{
  ConfidentialAssetId::operator=(&this->asset_,asset);
  ConfidentialValue::operator=(&this->confidential_value_,confidential_value);
  ConfidentialNonce::operator=(&this->nonce_,nonce);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->surjection_proof_).data_,&surjection_proof->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            (&(this->range_proof_).data_,&range_proof->data_);
  return;
}

Assistant:

void ConfidentialTxOut::SetCommitment(
    const ConfidentialAssetId &asset,
    const ConfidentialValue &confidential_value,
    const ConfidentialNonce &nonce, const ByteData &surjection_proof,
    const ByteData &range_proof) {
  asset_ = asset;
  confidential_value_ = confidential_value;
  SetNonce(nonce);
  surjection_proof_ = surjection_proof;
  range_proof_ = range_proof;
}